

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pagerAddPageToRollbackJournal(PgHdr *pPg)

{
  u32 uVar1;
  uint uVar2;
  long in_RDI;
  i64 iOff;
  char *pData2;
  u32 cksum;
  int rc;
  Pager *pPager;
  i64 in_stack_ffffffffffffffc8;
  u32 val;
  u8 *aData;
  Pgno pgno;
  undefined4 uVar3;
  Bitvec *p;
  uint local_4;
  
  p = *(Bitvec **)(in_RDI + 0x28);
  uVar3 = 0xaaaaaaaa;
  val = (u32)((ulong)*(i64 *)((long)&p->u + 0x50) >> 0x20);
  aData = *(u8 **)(in_RDI + 8);
  uVar1 = pager_cksum((Pager *)p,aData);
  *(ushort *)(in_RDI + 0x34) = *(ushort *)(in_RDI + 0x34) | 8;
  local_4 = write32bits((sqlite3_file *)CONCAT44(uVar3,uVar1),(i64)aData,val);
  if ((local_4 == 0) &&
     (local_4 = sqlite3OsWrite((sqlite3_file *)(ulong)uVar1,aData,val,in_stack_ffffffffffffffc8),
     local_4 == 0)) {
    local_4 = write32bits((sqlite3_file *)(ulong)uVar1,(i64)aData,val);
    pgno = (Pgno)((ulong)aData >> 0x20);
    if (local_4 == 0) {
      (p->u).apSub[10] = (Bitvec *)((long)&(p->u).apSub[0x17]->iDivisor + (long)(p->u).apSub[10]);
      (p->u).aHash[9] = (p->u).aHash[9] + 1;
      uVar2 = sqlite3BitvecSet(p,0);
      local_4 = addToSavepointBitvecs((Pager *)CONCAT44(uVar2,uVar1),pgno);
      local_4 = local_4 | uVar2;
    }
  }
  return local_4;
}

Assistant:

static SQLITE_NOINLINE int pagerAddPageToRollbackJournal(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  int rc;
  u32 cksum;
  char *pData2;
  i64 iOff = pPager->journalOff;

  /* We should never write to the journal file the page that
  ** contains the database locks.  The following assert verifies
  ** that we do not. */
  assert( pPg->pgno!=PAGER_SJ_PGNO(pPager) );

  assert( pPager->journalHdr<=pPager->journalOff );
  pData2 = pPg->pData;
  cksum = pager_cksum(pPager, (u8*)pData2);

  /* Even if an IO or diskfull error occurs while journalling the
  ** page in the block above, set the need-sync flag for the page.
  ** Otherwise, when the transaction is rolled back, the logic in
  ** playback_one_page() will think that the page needs to be restored
  ** in the database file. And if an IO error occurs while doing so,
  ** then corruption may follow.
  */
  pPg->flags |= PGHDR_NEED_SYNC;

  rc = write32bits(pPager->jfd, iOff, pPg->pgno);
  if( rc!=SQLITE_OK ) return rc;
  rc = sqlite3OsWrite(pPager->jfd, pData2, pPager->pageSize, iOff+4);
  if( rc!=SQLITE_OK ) return rc;
  rc = write32bits(pPager->jfd, iOff+pPager->pageSize+4, cksum);
  if( rc!=SQLITE_OK ) return rc;

  IOTRACE(("JOUT %p %d %lld %d\n", pPager, pPg->pgno,
           pPager->journalOff, pPager->pageSize));
  PAGER_INCR(sqlite3_pager_writej_count);
  PAGERTRACE(("JOURNAL %d page %d needSync=%d hash(%08x)\n",
       PAGERID(pPager), pPg->pgno,
       ((pPg->flags&PGHDR_NEED_SYNC)?1:0), pager_pagehash(pPg)));

  pPager->journalOff += 8 + pPager->pageSize;
  pPager->nRec++;
  assert( pPager->pInJournal!=0 );
  rc = sqlite3BitvecSet(pPager->pInJournal, pPg->pgno);
  testcase( rc==SQLITE_NOMEM );
  assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
  rc |= addToSavepointBitvecs(pPager, pPg->pgno);
  assert( rc==SQLITE_OK || rc==SQLITE_NOMEM );
  return rc;
}